

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edge.cc
# Opt level: O0

void __thiscall tchecker::system::edges_t::add_edges(edges_t *this,edges_t *edges)

{
  bool bVar1;
  process_id_t pid;
  loc_id_t src;
  loc_id_t tgt;
  event_id_t event_id;
  reference __r;
  element_type *peVar2;
  attributes_t *attributes;
  undefined1 local_40 [8];
  edge_const_shared_ptr_t edge;
  const_iterator __end2;
  const_iterator __begin2;
  edges_collection_t *__range2;
  edges_t *edges_local;
  edges_t *this_local;
  
  __end2 = std::
           vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>
           ::begin(&edges->_edges);
  edge.super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          std::
          vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>
          ::end(&edges->_edges);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::shared_ptr<tchecker::system::edge_t>_*,_std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>_>
                                *)&edge.
                                   super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount);
    if (!bVar1) break;
    __r = __gnu_cxx::
          __normal_iterator<const_std::shared_ptr<tchecker::system::edge_t>_*,_std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>_>
          ::operator*(&__end2);
    std::shared_ptr<tchecker::system::edge_t_const>::shared_ptr<tchecker::system::edge_t,void>
              ((shared_ptr<tchecker::system::edge_t_const> *)local_40,__r);
    peVar2 = std::
             __shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_40);
    pid = edge_t::pid(peVar2);
    peVar2 = std::
             __shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_40);
    src = edge_t::src(peVar2);
    peVar2 = std::
             __shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_40);
    tgt = edge_t::tgt(peVar2);
    peVar2 = std::
             __shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_40);
    event_id = edge_t::event_id(peVar2);
    peVar2 = std::
             __shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_40);
    attributes = edge_t::attributes(peVar2);
    add_edge(this,pid,src,tgt,event_id,attributes);
    std::shared_ptr<const_tchecker::system::edge_t>::~shared_ptr
              ((shared_ptr<const_tchecker::system::edge_t> *)local_40);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<tchecker::system::edge_t>_*,_std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void edges_t::add_edges(tchecker::system::edges_t const & edges)
{
  for (tchecker::system::edge_const_shared_ptr_t edge : edges._edges)
    add_edge(edge->pid(), edge->src(), edge->tgt(), edge->event_id(), edge->attributes());
}